

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  xmlNsPtr pxVar4;
  void *pvVar5;
  _xmlNode *p_Var6;
  long lVar7;
  long *plVar8;
  xmlNodePtr pxVar9;
  uint uVar10;
  xmlNodePtr node;
  xmlNs *pxVar11;
  uint uVar12;
  void *pvVar13;
  uint uVar14;
  _xmlAttr *p_Var15;
  ulong local_48;
  
  iVar2 = -1;
  if (((tree != (xmlNodePtr)0x0) && (iVar2 = -1, tree->type == XML_ELEMENT_NODE)) &&
     (tree->doc == doc)) {
    iVar2 = 0;
    uVar10 = 0;
    local_48 = 0;
    pvVar13 = (void *)0x0;
    pxVar9 = tree;
    do {
      pxVar11 = pxVar9->ns;
      if (pxVar11 != (xmlNs *)0x0) {
        if ((int)uVar10 < 1) {
          uVar3 = 0;
LAB_00151041:
          if ((uint)uVar3 != uVar10) goto LAB_001510ed;
        }
        else {
          plVar8 = (long *)((long)pvVar13 + 8);
          uVar3 = 0;
          do {
            if ((xmlNs *)plVar8[-1] == pxVar11) {
              pxVar11 = (xmlNs *)*plVar8;
              pxVar9->ns = pxVar11;
              goto LAB_00151041;
            }
            uVar3 = uVar3 + 1;
            plVar8 = plVar8 + 2;
          } while (uVar10 != uVar3);
        }
        pxVar4 = xmlNewReconciledNs(tree,pxVar11);
        if (pxVar4 == (xmlNsPtr)0x0) {
LAB_001510db:
          iVar2 = -1;
        }
        else {
          uVar1 = (uint)local_48;
          pvVar5 = pvVar13;
          uVar3 = local_48;
          if ((int)uVar1 <= (int)uVar10) {
            if ((int)uVar1 < 1) {
              uVar3 = 10;
            }
            else {
              if (999999999 < uVar1) goto LAB_001510db;
              uVar14 = uVar1 + 1 >> 1;
              uVar12 = uVar14 + uVar1;
              if (1000000000 - uVar14 < uVar1) {
                uVar12 = 1000000000;
              }
              uVar3 = (ulong)uVar12;
            }
            pvVar5 = (*xmlRealloc)(pvVar13,uVar3 << 4);
            if (pvVar5 == (void *)0x0) goto LAB_001510db;
          }
          local_48 = uVar3;
          lVar7 = (long)(int)uVar10;
          *(xmlNsPtr *)((long)pvVar5 + lVar7 * 0x10 + 8) = pxVar4;
          uVar10 = uVar10 + 1;
          *(xmlNs **)((long)pvVar5 + lVar7 * 0x10) = pxVar9->ns;
          pvVar13 = pvVar5;
        }
        pxVar9->ns = pxVar4;
      }
LAB_001510ed:
      if (pxVar9->type == XML_ELEMENT_NODE) {
        for (p_Var15 = pxVar9->properties; p_Var15 != (_xmlAttr *)0x0; p_Var15 = p_Var15->next) {
          pxVar11 = p_Var15->ns;
          if (pxVar11 != (xmlNs *)0x0) {
            if ((int)uVar10 < 1) {
              uVar3 = 0;
LAB_00151140:
              if ((uint)uVar3 != uVar10) goto LAB_001511f1;
            }
            else {
              plVar8 = (long *)((long)pvVar13 + 8);
              uVar3 = 0;
              do {
                if ((xmlNs *)plVar8[-1] == pxVar11) {
                  pxVar11 = (xmlNs *)*plVar8;
                  p_Var15->ns = pxVar11;
                  goto LAB_00151140;
                }
                uVar3 = uVar3 + 1;
                plVar8 = plVar8 + 2;
              } while (uVar10 != uVar3);
            }
            pxVar4 = xmlNewReconciledNs(tree,pxVar11);
            if (pxVar4 == (xmlNsPtr)0x0) {
LAB_00151176:
              iVar2 = -1;
            }
            else {
              uVar1 = (uint)local_48;
              pvVar5 = pvVar13;
              uVar3 = local_48;
              if ((int)uVar1 <= (int)uVar10) {
                if ((int)uVar1 < 1) {
                  uVar3 = 10;
                }
                else {
                  if (999999999 < uVar1) goto LAB_00151176;
                  uVar12 = uVar1 + 1 >> 1;
                  uVar3 = (ulong)(uVar12 + uVar1);
                  if (1000000000 - uVar12 < uVar1) {
                    uVar3 = 1000000000;
                  }
                }
                pvVar5 = (*xmlRealloc)(pvVar13,uVar3 << 4);
                if (pvVar5 == (void *)0x0) {
                  iVar2 = -1;
                  goto LAB_001511ed;
                }
              }
              lVar7 = (long)(int)uVar10;
              *(xmlNsPtr *)((long)pvVar5 + lVar7 * 0x10 + 8) = pxVar4;
              uVar10 = uVar10 + 1;
              *(xmlNs **)((long)pvVar5 + lVar7 * 0x10) = p_Var15->ns;
              pvVar13 = pvVar5;
              local_48 = uVar3;
            }
LAB_001511ed:
            p_Var15->ns = pxVar4;
          }
LAB_001511f1:
        }
      }
      p_Var6 = pxVar9->children;
      if ((p_Var6 == (_xmlNode *)0x0) || (pxVar9->type == XML_ENTITY_REF_NODE)) {
        if (pxVar9 == tree) break;
        p_Var6 = pxVar9->next;
        if (p_Var6 == (_xmlNode *)0x0) {
          do {
            p_Var6 = pxVar9;
            if (p_Var6 == tree) goto LAB_00151252;
            pxVar9 = p_Var6;
            if (p_Var6->parent != (xmlNodePtr)0x0) {
              pxVar9 = p_Var6->parent;
            }
            if ((pxVar9 != tree) && (p_Var6 = pxVar9->next, p_Var6 != (_xmlNode *)0x0))
            goto LAB_00151252;
          } while (pxVar9->parent != (_xmlNode *)0x0);
          p_Var6 = (_xmlNode *)0x0;
LAB_00151252:
          if (p_Var6 == tree) break;
        }
      }
      pxVar9 = p_Var6;
    } while (p_Var6 != (_xmlNode *)0x0);
    if (pvVar13 != (void *)0x0) {
      (*xmlFree)(pvVar13);
    }
  }
  return iVar2;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsCache *cache = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    for (i = 0; i < nbCache; i++) {
	        if (cache[i].oldNs == node->ns) {
		    node->ns = cache[i].newNs;
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(tree, node->ns);
		if (n == NULL) {
                    ret = -1;
                } else {
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if ((sizeCache <= nbCache) &&
                        (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                        ret = -1;
		    } else {
                        cache[nbCache].newNs = n;
                        cache[nbCache++].oldNs = node->ns;
                    }
                }
		node->ns = n;
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    for (i = 0; i < nbCache; i++) {
			if (cache[i].oldNs == attr->ns) {
			    attr->ns = cache[i].newNs;
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(tree, attr->ns);
			if (n == NULL) {
                            ret = -1;
                        } else {
			    /*
			     * check if we need to grow the cache buffers.
			     */
                            if ((sizeCache <= nbCache) &&
                                (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                                ret = -1;
                            } else {
                                cache[nbCache].newNs = n;
                                cache[nbCache++].oldNs = attr->ns;
			    }
			}
			attr->ns = n;
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (cache != NULL)
	xmlFree(cache);
    return(ret);
}